

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.h
# Opt level: O1

void llvm::yaml::ScalarEnumerationTraits<llvm::dwarf::Form,_void>::enumeration(IO *io,Form *value)

{
  int iVar1;
  
  iVar1 = (*io->_vptr_IO[2])();
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_addr",(ulong)(*value == DW_FORM_addr & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_addr;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_block2",(ulong)(*value == DW_FORM_block2 & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_block2;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_block4",(ulong)(*value == DW_FORM_block4 & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_block4;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_data2",(ulong)(*value == DW_FORM_data2 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_data2;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_data4",(ulong)(*value == DW_FORM_data4 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_data4;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_data8",(ulong)(*value == DW_FORM_data8 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_data8;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_string",(ulong)(*value == DW_FORM_string & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_string;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_block",(ulong)(*value == DW_FORM_block & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_block;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_block1",(ulong)(*value == DW_FORM_block1 & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_block1;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_data1",(ulong)(*value == DW_FORM_data1 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_data1;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_flag",(ulong)(*value == DW_FORM_flag & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_flag;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_sdata",(ulong)(*value == DW_FORM_sdata & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_sdata;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_strp",(ulong)(*value == DW_FORM_strp & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_strp;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_udata",(ulong)(*value == DW_FORM_udata & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_udata;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_ref_addr",(ulong)(*value == DW_FORM_ref_addr & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_ref_addr;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_ref1",(ulong)(*value == DW_FORM_ref1 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_ref1;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_ref2",(ulong)(*value == DW_FORM_ref2 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_ref2;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_ref4",(ulong)(*value == DW_FORM_ref4 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_ref4;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_ref8",(ulong)(*value == DW_FORM_ref8 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_ref8;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_ref_udata",(ulong)(*value == DW_FORM_ref_udata & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_ref_udata;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_indirect",(ulong)(*value == DW_FORM_indirect & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_indirect;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_sec_offset",(ulong)(*value == DW_FORM_sec_offset & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_sec_offset;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_exprloc",(ulong)(*value == DW_FORM_exprloc & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_exprloc;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_flag_present",(ulong)(*value == DW_FORM_flag_present & (byte)iVar1)
                    );
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_flag_present;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_ref_sig8",(ulong)(*value == DW_FORM_ref_sig8 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_ref_sig8;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_strx",(ulong)(*value == DW_FORM_strx & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_strx;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_addrx",(ulong)(*value == DW_FORM_addrx & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_addrx;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_ref_sup4",(ulong)(*value == DW_FORM_ref_sup4 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_ref_sup4;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_strp_sup",(ulong)(*value == DW_FORM_strp_sup & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_strp_sup;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_data16",(ulong)(*value == DW_FORM_data16 & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_data16;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_line_strp",(ulong)(*value == DW_FORM_line_strp & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_line_strp;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_implicit_const",
                     (ulong)(*value == DW_FORM_implicit_const & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_implicit_const;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_loclistx",(ulong)(*value == DW_FORM_loclistx & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_loclistx;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_rnglistx",(ulong)(*value == DW_FORM_rnglistx & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_rnglistx;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_ref_sup8",(ulong)(*value == DW_FORM_ref_sup8 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_ref_sup8;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_strx1",(ulong)(*value == DW_FORM_strx1 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_strx1;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_strx2",(ulong)(*value == DW_FORM_strx2 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_strx2;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_strx3",(ulong)(*value == DW_FORM_strx3 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_strx3;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_strx4",(ulong)(*value == DW_FORM_strx4 & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_strx4;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_addrx1",(ulong)(*value == DW_FORM_addrx1 & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_addrx1;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_addrx2",(ulong)(*value == DW_FORM_addrx2 & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_addrx2;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_addrx3",(ulong)(*value == DW_FORM_addrx3 & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_addrx3;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_FORM_addrx4",(ulong)(*value == DW_FORM_addrx4 & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_addrx4;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_GNU_addr_index",
                     (ulong)(*value == DW_FORM_GNU_addr_index & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_GNU_addr_index;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_GNU_str_index",
                     (ulong)(*value == DW_FORM_GNU_str_index & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_GNU_str_index;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_GNU_ref_alt",(ulong)(*value == DW_FORM_GNU_ref_alt & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_GNU_ref_alt;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_FORM_GNU_strp_alt",(ulong)(*value == DW_FORM_GNU_strp_alt & (byte)iVar1)
                    );
  if ((char)iVar1 != '\0') {
    *value = DW_FORM_GNU_strp_alt;
  }
  IO::enumFallback<llvm::yaml::Hex16,llvm::dwarf::Form>(io,value);
  return;
}

Assistant:

static void enumeration(IO &io, dwarf::Form &value) {
#include "llvm/BinaryFormat/Dwarf.def"
    io.enumFallback<Hex16>(value);
  }